

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O0

uint32_t __thiscall cfd::core::AbstractTransaction::GetWeight(AbstractTransaction *this)

{
  CfdException *this_00;
  allocator local_61;
  string local_60;
  CfdSourceLocation local_40;
  int local_24;
  wally_tx *pwStack_20;
  int ret;
  wally_tx *tx_pointer;
  size_t weight;
  AbstractTransaction *this_local;
  
  tx_pointer = (wally_tx *)0x0;
  pwStack_20 = (wally_tx *)this->wally_tx_pointer_;
  weight = (size_t)this;
  local_24 = wally_tx_get_weight(pwStack_20,(size_t *)&tx_pointer);
  if (local_24 != 0) {
    local_40.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_transaction_common.cpp"
                 ,0x2f);
    local_40.filename = local_40.filename + 1;
    local_40.line = 0x254;
    local_40.funcname = "GetWeight";
    logger::warn<int&>(&local_40,"wally_tx_get_weight NG[{}].",&local_24);
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_60,"transaction weight calc error.",&local_61);
    CfdException::CfdException(this_00,kCfdIllegalStateError,&local_60);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return (uint32_t)tx_pointer;
}

Assistant:

uint32_t AbstractTransaction::GetWeight() const {
  size_t weight = 0;
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  int ret = wally_tx_get_weight(tx_pointer, &weight);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_get_weight NG[{}].", ret);
    throw CfdException(
        kCfdIllegalStateError, "transaction weight calc error.");
  }
  return static_cast<uint32_t>(weight);
}